

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

void Curl_cookie_cleanup(CookieInfo *c)

{
  Cookie *pCVar1;
  Cookie *co;
  long lVar2;
  
  if (c == (CookieInfo *)0x0) {
    return;
  }
  (*Curl_cfree)(c->filename);
  lVar2 = 0;
  do {
    co = c->cookies[lVar2];
    while (co != (Cookie *)0x0) {
      pCVar1 = co->next;
      freecookie(co);
      co = pCVar1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  (*Curl_cfree)(c);
  return;
}

Assistant:

void Curl_cookie_cleanup(struct CookieInfo *c)
{
  if(c) {
    unsigned int i;
    free(c->filename);
    for(i = 0; i < COOKIE_HASH_SIZE; i++)
      Curl_cookie_freelist(c->cookies[i]);
    free(c); /* free the base struct as well */
  }
}